

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O0

void __thiscall RoboClaw::clear(RoboClaw *this)

{
  int iVar1;
  size_t in_RCX;
  void *__buf;
  int in_ESI;
  RoboClaw *in_RDI;
  
  if (in_RDI->m_serial != 0) {
    while (iVar1 = available(in_RDI), iVar1 != 0) {
      read(in_RDI,in_ESI,__buf,in_RCX);
    }
  }
  return;
}

Assistant:

void RoboClaw::clear()
{
    // read everything on serial port.
    if( m_serial )
    {
        while( available() )
        {
            read();
        }
    }
}